

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonBondedInteractionType.cpp
# Opt level: O0

void __thiscall
OpenMD::NonBondedInteractionType::NonBondedInteractionType(NonBondedInteractionType *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__NonBondedInteractionType_00500b38;
  std::pair<OpenMD::AtomType_*,_OpenMD::AtomType_*>::
  pair<OpenMD::AtomType_*,_OpenMD::AtomType_*,_true>
            ((pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> *)(in_RDI + 3));
  PropertyMap::PropertyMap((PropertyMap *)0x2c89f8);
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  *(undefined1 *)((long)in_RDI + 10) = 0;
  *(undefined1 *)((long)in_RDI + 0xb) = 0;
  *(undefined1 *)((long)in_RDI + 0xc) = 0;
  *(undefined1 *)((long)in_RDI + 0xd) = 0;
  *(undefined1 *)((long)in_RDI + 0xe) = 0;
  *(undefined1 *)((long)in_RDI + 0xf) = 0;
  *(undefined1 *)(in_RDI + 2) = 0;
  *(undefined1 *)((long)in_RDI + 0x11) = 0;
  *(undefined1 *)((long)in_RDI + 0x12) = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  return;
}

Assistant:

NonBondedInteractionType::NonBondedInteractionType() {
    nbitp.is_LennardJones       = false;
    nbitp.is_Morse              = false;
    nbitp.is_MAW                = false;
    nbitp.is_EAMTable           = false;
    nbitp.is_EAMZhou            = false;
    nbitp.is_EAMOxides          = false;
    nbitp.is_SC                 = false;
    nbitp.is_RepulsivePower     = false;
    nbitp.is_Mie                = false;
    nbitp.is_Buckingham         = false;
    nbitp.is_InversePowerSeries = false;
    atomTypes_.first            = NULL;
    atomTypes_.second           = NULL;
  }